

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O1

void __thiscall
duckdb::BoundBetweenExpression::Serialize(BoundBetweenExpression *this,Serializer *serializer)

{
  Expression::Serialize(&this->super_Expression,serializer);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,200,"input",&this->input);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xc9,"lower",&this->lower);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xca,"upper",&this->upper);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0xcb,"lower_inclusive",&this->lower_inclusive);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0xcc,"upper_inclusive",&this->upper_inclusive);
  return;
}

Assistant:

void BoundBetweenExpression::Serialize(Serializer &serializer) const {
	Expression::Serialize(serializer);
	serializer.WritePropertyWithDefault<unique_ptr<Expression>>(200, "input", input);
	serializer.WritePropertyWithDefault<unique_ptr<Expression>>(201, "lower", lower);
	serializer.WritePropertyWithDefault<unique_ptr<Expression>>(202, "upper", upper);
	serializer.WritePropertyWithDefault<bool>(203, "lower_inclusive", lower_inclusive);
	serializer.WritePropertyWithDefault<bool>(204, "upper_inclusive", upper_inclusive);
}